

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::Switch::sizeHint(Switch *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  SwitchPrivate *pSVar5;
  int *piVar6;
  undefined1 local_9c [8];
  QRect r;
  QRect local_7c;
  int local_6c;
  int local_68;
  int onWidth;
  int offWidth;
  QStyleOption local_58 [8];
  QStyleOption opt;
  undefined1 local_38 [32];
  Switch *local_18;
  Switch *this_local;
  
  local_18 = this;
  QStyleOption::QStyleOption(local_58,1,0);
  QStyleOption::initFrom((QWidget *)local_58);
  iVar3 = QFontMetrics::ascent();
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  pSVar5->radius = iVar3;
  local_68 = 0;
  local_6c = 0;
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  bVar2 = QString::isEmpty(&pSVar5->offText);
  if (!bVar2) {
    QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>::
    operator->(&this->d);
    local_7c = (QRect)QFontMetrics::boundingRect((QString *)local_38);
    local_68 = QRect::width(&local_7c);
  }
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  bVar2 = QString::isEmpty(&pSVar5->onText);
  if (!bVar2) {
    QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>::
    operator->(&this->d);
    r._8_8_ = QFontMetrics::boundingRect((QString *)local_38);
    local_6c = QRect::width((QRect *)&r.x2);
  }
  piVar6 = qMax<int>(&local_68,&local_6c);
  iVar3 = *piVar6;
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  pSVar5->textWidth = iVar3;
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  iVar3 = pSVar5->textWidth;
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  iVar4 = pSVar5->radius;
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  iVar1 = pSVar5->radius;
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  QRect::QRect((QRect *)local_9c,0,0,iVar3 + iVar4 * 3 + iVar1 / 2 + 2,pSVar5->radius * 2 + 2);
  pSVar5 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  SwitchPrivate::initOffset(pSVar5,(QRect *)local_9c);
  iVar3 = QRect::width((QRect *)local_9c);
  iVar4 = QRect::height((QRect *)local_9c);
  QSize::QSize((QSize *)&this_local,iVar3,iVar4);
  QStyleOption::~QStyleOption(local_58);
  return (QSize)this_local;
}

Assistant:

QSize
Switch::sizeHint() const
{
	QStyleOption opt;
	opt.initFrom( this );

	d->radius = opt.fontMetrics.ascent();

	int offWidth = 0;
	int onWidth = 0;

	if( !d->offText.isEmpty() )
		offWidth = opt.fontMetrics.boundingRect( d->offText ).width();

	if( !d->onText.isEmpty() )
		onWidth = opt.fontMetrics.boundingRect( d->onText ).width();

	d->textWidth = qMax( offWidth, onWidth );

	const QRect r( 0, 0,
		d->textWidth + d->radius * 3 + d->radius / 2 + 2, d->radius * 2 + 2 );

	d->initOffset( r );

	return QSize( r.width(), r.height() );
}